

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::MergeFrom
          (FeatureVectorizer_InputColumn *this,FeatureVectorizer_InputColumn *from)

{
  void *pvVar1;
  string *initial_value;
  string *psVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/FeatureVectorizer.pb.cc"
               ,0x108);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  initial_value = (from->inputcolumn_).ptr_;
  if ((initial_value->_M_string_length != 0) &&
     (psVar2 = (this->inputcolumn_).ptr_, psVar2 != initial_value)) {
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->inputcolumn_,initial_value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  if (from->inputdimensions_ != 0) {
    this->inputdimensions_ = from->inputdimensions_;
  }
  return;
}

Assistant:

void FeatureVectorizer_InputColumn::MergeFrom(const FeatureVectorizer_InputColumn& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureVectorizer.InputColumn)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.inputcolumn().size() > 0) {

    inputcolumn_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.inputcolumn_);
  }
  if (from.inputdimensions() != 0) {
    set_inputdimensions(from.inputdimensions());
  }
}